

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.h
# Opt level: O3

void __thiscall server::ctfservmode::died(ctfservmode *this,clientinfo *ci,clientinfo *actor)

{
  flag *pfVar1;
  int iVar2;
  clientinfo *dropper;
  long lVar3;
  long lVar4;
  
  if (this->notgotflags == false) {
    if (((gamemode + 3U < 0x1a) && ((0x4c0000UL >> ((ulong)(gamemode + 3U) & 0x3f) & 1) != 0)) &&
       (iVar2 = (this->flags).ulen, 0 < iVar2)) {
      lVar4 = 0x34;
      lVar3 = 0;
      do {
        if (*(int *)((long)&((this->flags).buf)->id + lVar4) == ci->clientnum) {
          deadflag(this,(int)lVar3);
          iVar2 = (this->flags).ulen;
        }
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + 0x44;
      } while (lVar3 < iVar2);
    }
    dropper = (clientinfo *)0x0;
    if ((actor != (clientinfo *)0x0) && (ctftkpenalty != 0)) {
      if ((gamemode + 3U < 0x1a && actor != ci) &&
         ((0x55fUL >> ((ulong)(gamemode + 3U) & 0x3f) & 1) == 0)) {
        iVar2 = strcmp(actor->team,ci->team);
        dropper = (clientinfo *)0x0;
        if (iVar2 == 0) {
          dropper = actor;
        }
      }
      else {
        dropper = (clientinfo *)0x0;
      }
    }
    dropflag(this,ci,dropper);
    lVar3 = (long)(this->flags).ulen;
    if (0 < lVar3) {
      pfVar1 = (this->flags).buf;
      iVar2 = ci->clientnum;
      lVar4 = 0;
      do {
        if (*(int *)((long)&pfVar1->dropper + lVar4) == iVar2) {
          *(undefined8 *)((long)&pfVar1->dropcount + lVar4) = 0xffffffff00000000;
        }
        lVar4 = lVar4 + 0x44;
      } while (lVar3 * 0x44 != lVar4);
    }
  }
  return;
}

Assistant:

void died(clientinfo *ci, clientinfo *actor)
    {
        if(notgotflags) return;
        if(m_hold) loopv(flags) if(flags[i].owner==ci->clientnum) deadflag(i);
        dropflag(ci, ctftkpenalty && actor && actor != ci && isteam(actor->team, ci->team) ? actor : NULL);
        loopv(flags) if(flags[i].dropper == ci->clientnum) { flags[i].dropper = -1; flags[i].dropcount = 0; }
    }